

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall
Node::OutputVirtualList
          (Node *this,ostream *os,Node *Channel,Node *MainType,int ExtType,int GlobalStat)

{
  ostream *poVar1;
  int iVar2;
  string local_80;
  string local_60;
  int local_3c;
  VariableStruct *local_38;
  
  iVar2 = this->Type;
  while (iVar2 == 0x1f5) {
    OutputVirtualList(this->Tree[0],os,Channel,MainType,ExtType,GlobalStat);
    this = this->Tree[1];
    iVar2 = this->Type;
  }
  local_3c = ExtType;
  local_38 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
  iVar2 = 0;
  if (0 < Level) {
    iVar2 = Level;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"VirtualArray<",0xd);
  OutputNodeVarType_abi_cxx11_(&local_60,this->Tree[1]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"> ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_38 == (VariableStruct *)0x0) {
    genname(&local_80,&this->Tree[0]->TextValue);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  }
  else {
    VariableStruct::GetName_abi_cxx11_(&local_80,local_38,0);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  Expression_abi_cxx11_(&local_80,Channel);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  Expression_abi_cxx11_(&local_60,this->Tree[2]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  iVar2 = local_3c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (this->Tree[3] != (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    Expression_abi_cxx11_(&local_80,this->Tree[3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,");",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  if (this->Block[0] != (Node *)0x0) {
    OutputVirtualList(this->Block[0],os,Channel,MainType,iVar2,GlobalStat);
  }
  return;
}

Assistant:

void Node::OutputVirtualList(
	std::ostream& os,	/**< iostream to write C++ code */
	Node* Channel,		/**< IO channe to use */
	Node* MainType,		/**< Main stat type */
	int ExtType,		/**< Extra data type */
	int GlobalStat		/**< Global status */
)
{
	VariableStruct *ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:

		//
		// Put multiple items on seperate lines
		//
		Tree[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		Tree[1]->OutputVirtualList(os, Channel, MainType, ExtType);

		break;

	default:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);

		os << Indent() <<
			"VirtualArray<" <<
			Tree[1]->OutputNodeVarType() << "> ";

		if (ThisVar != 0)
		{
			os << ThisVar->GetName() << "(";
		}
		else
		{
			os << genname(Tree[0]->TextValue) << "(";
		}
		os << Channel->Expression() << ", " << Tree[2]->Expression();

		if (Tree[3] != 0)
		{
			os << ", " << Tree[3]->Expression();
		}
		os << ");" << std::endl;

		if (Block[0] != 0)
		{
			Block[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		}
		break;

	}
}